

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O2

bool __thiscall Personality::PushGreenCard(Personality *this,GreenCard *card)

{
  Type TVar1;
  Follower *newFollow;
  value_type local_18;
  
  TVar1 = Card::getType(&card->super_Card);
  local_18 = (value_type)card;
  if (TVar1 == FOLLOWER) {
    if ((ulong)(long)this->maxFollowers <=
        (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
        _M_size) {
      return false;
    }
    std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::push_back
              (&this->followers,(value_type *)&local_18);
  }
  else {
    if ((ulong)(long)this->maxItems <=
        (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node._M_size) {
      return false;
    }
    std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::push_back(&this->items,&local_18);
  }
  return true;
}

Assistant:

bool Personality::PushGreenCard(GreenCard * card)                   //pushes new item or follower
{
    if (card->getType() == FOLLOWER)
    {
        if (followers.size() >= maxFollowers)
            return false;

        Follower * newFollow = reinterpret_cast<Follower*>(card);
        followers.push_back(newFollow);
    }
    else
    {
        if (items.size() >= maxItems)
            return false;

        Item * newItem = reinterpret_cast<Item*>(card);
        items.push_back(newItem);
    }
    return true;
}